

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::VirtualInterfaceTypeSyntax::setChild
          (VirtualInterfaceTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  ParameterValueAssignmentSyntax *pPVar3;
  logic_error *this_00;
  Token TVar4;
  long lStack_f0;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (4 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
               ,&local_e1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_e0,0x35e3);
    std::operator+(&local_80,&local_a0,&local_e0);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pPVar3 = (ParameterValueAssignmentSyntax *)TVar4.info;
    uVar1 = TVar4._0_8_;
    (this->virtualKeyword).kind = (short)uVar1;
    (this->virtualKeyword).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->virtualKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->virtualKeyword).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_f0 = 0x18;
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pPVar3 = (ParameterValueAssignmentSyntax *)TVar4.info;
    uVar1 = TVar4._0_8_;
    (this->interfaceKeyword).kind = (short)uVar1;
    (this->interfaceKeyword).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->interfaceKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->interfaceKeyword).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_f0 = 0x28;
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pPVar3 = (ParameterValueAssignmentSyntax *)TVar4.info;
    uVar1 = TVar4._0_8_;
    (this->name).kind = (short)uVar1;
    (this->name).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->name).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_f0 = 0x38;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    lStack_f0 = 0x40;
    if (pSVar2 != (SyntaxNode *)0x0) {
      pSVar2 = TokenOrSyntax::node(&child);
      pPVar3 = SyntaxNode::as<slang::syntax::ParameterValueAssignmentSyntax>(pSVar2);
      break;
    }
    goto LAB_0027b8f7;
  case 4:
    pSVar2 = TokenOrSyntax::node(&child);
    lStack_f0 = 0x48;
    if (pSVar2 != (SyntaxNode *)0x0) {
      pSVar2 = TokenOrSyntax::node(&child);
      pPVar3 = (ParameterValueAssignmentSyntax *)
               SyntaxNode::as<slang::syntax::DotMemberClauseSyntax>(pSVar2);
      break;
    }
LAB_0027b8f7:
    pPVar3 = (ParameterValueAssignmentSyntax *)0x0;
  }
  *(ParameterValueAssignmentSyntax **)
   ((long)&(this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent + lStack_f0)
       = pPVar3;
  return;
}

Assistant:

void VirtualInterfaceTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: virtualKeyword = child.token(); return;
        case 1: interfaceKeyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 4: modport = child.node() ? &child.node()->as<DotMemberClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}